

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int rebuild_ch_inner_extensions
              (ptls_buffer_t *buf,uint8_t **src,uint8_t *end,uint8_t *outer_ext,
              uint8_t *outer_ext_end)

{
  byte *pbVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  size_t body_size;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  ulong uStack_f0;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t local_d0;
  ushort local_ce;
  uint16_t local_cc;
  uint16_t local_ca;
  uint16_t _v;
  uint16_t outersize;
  uint16_t outertype;
  uint16_t reftype;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *puStack_70;
  uint16_t exttype;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  size_t body_start;
  size_t capacity;
  uint8_t *puStack_30;
  int ret;
  uint8_t *outer_ext_end_local;
  uint8_t *outer_ext_local;
  uint8_t *end_local;
  uint8_t **src_local;
  ptls_buffer_t *buf_local;
  
  body_start = 2;
  puStack_30 = outer_ext_end;
  outer_ext_end_local = outer_ext;
  outer_ext_local = end;
  end_local = (uint8_t *)src;
  src_local = &buf->base;
  capacity._4_4_ = ptls_buffer__do_pushv(buf,"",2);
  if (capacity._4_4_ == 0) {
    _capacity = (size_t)src_local[2];
    _block_size = 2;
    if ((ulong)((long)outer_ext_local - *(long *)end_local) < 2) {
      capacity._4_4_ = 0x32;
    }
    else {
      _block_size64 = 0;
      do {
        pbVar1 = *(byte **)end_local;
        *(byte **)end_local = pbVar1 + 1;
        _block_size64 = _block_size64 << 8 | (ulong)*pbVar1;
        _block_size = _block_size - 1;
      } while (_block_size != 0);
      if ((ulong)((long)outer_ext_local - *(long *)end_local) < _block_size64) {
        capacity._4_4_ = 0x32;
      }
      else {
        puStack_70 = (uint8_t *)(*(long *)end_local + _block_size64);
        _block_size = 0;
        capacity._4_4_ = 0;
        do {
          if (*(uint8_t **)end_local == puStack_70) {
            if (*(uint8_t **)end_local != puStack_70) {
              return 0x32;
            }
            uVar4 = (long)src_local[2] - _capacity;
            if (body_start != 0xffffffffffffffff) {
              if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar4)) {
                return 0x20c;
              }
              for (; body_start != 0; body_start = body_start - 1) {
                (*src_local)[_capacity - body_start] =
                     (uint8_t)(uVar4 >> (((char)body_start + -1) * '\b' & 0x3fU));
              }
              return capacity._4_4_;
            }
            iVar3 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)src_local,uVar4);
            return iVar3;
          }
          capacity._4_4_ =
               ptls_decode16((uint16_t *)((long)&_capacity_1 + 6),(uint8_t **)end_local,puStack_70);
          if (capacity._4_4_ != 0) {
            return capacity._4_4_;
          }
          _block_size_1 = 2;
          if ((ulong)((long)puStack_70 - *(long *)end_local) < 2) {
            return 0x32;
          }
          _block_size64_1 = 0;
          do {
            pbVar1 = *(byte **)end_local;
            *(byte **)end_local = pbVar1 + 1;
            _block_size64_1 = _block_size64_1 << 8 | (ulong)*pbVar1;
            _block_size_1 = _block_size_1 - 1;
          } while (_block_size_1 != 0);
          if ((ulong)((long)puStack_70 - *(long *)end_local) < _block_size64_1) {
            return 0x32;
          }
          _capacity_2 = *(long *)end_local + _block_size64_1;
          if (_capacity_1._6_2_ == -0x300) {
            _block_size_2 = 1;
            if (_capacity_2 == *(size_t *)end_local) {
              return 0x32;
            }
            _block_size64_2 = 0;
            do {
              pbVar1 = *(byte **)end_local;
              *(byte **)end_local = pbVar1 + 1;
              _block_size64_2 = _block_size64_2 << 8 | (ulong)*pbVar1;
              _block_size_2 = _block_size_2 - 1;
            } while (_block_size_2 != 0);
            if (_capacity_2 - *(long *)end_local < _block_size64_2) {
              return 0x32;
            }
            __v = (uint8_t *)(*(long *)end_local + _block_size64_2);
            capacity._4_4_ = 0;
            _block_size_2 = 0;
            do {
              iVar3 = ptls_decode16(&local_ca,(uint8_t **)end_local,__v);
              if (iVar3 != 0) {
                return iVar3;
              }
              if (local_ca == 0xfe0d) {
                return 0x2f;
              }
              capacity._4_4_ = 0;
              while( true ) {
                iVar3 = ptls_decode16(&local_cc,&outer_ext_end_local,puStack_30);
                if ((iVar3 != 0) ||
                   (iVar3 = ptls_decode16(&local_ce,&outer_ext_end_local,puStack_30), iVar3 != 0)) {
                  return 0x2f;
                }
                if ((long)puStack_30 - (long)outer_ext_end_local < (long)(ulong)local_ce) {
                  __assert_fail("outer_ext_end - outer_ext >= outersize",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                ,0xf63,
                                "int rebuild_ch_inner_extensions(ptls_buffer_t *, const uint8_t **, const uint8_t *const, const uint8_t *, const uint8_t *)"
                               );
                }
                if (local_cc == local_ca) break;
                outer_ext_end_local = outer_ext_end_local + (int)(uint)local_ce;
              }
              local_d0 = local_ca;
              capacity_1._6_1_ = (undefined1)(local_ca >> 8);
              capacity_1._7_1_ = (undefined1)local_ca;
              capacity._4_4_ =
                   ptls_buffer__do_pushv
                             ((ptls_buffer_t *)src_local,(void *)((long)&capacity_1 + 6),2);
              if (capacity._4_4_ != 0) {
                return capacity._4_4_;
              }
              body_start_1 = 2;
              capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)src_local,"",2);
              if (capacity._4_4_ != 0) {
                return capacity._4_4_;
              }
              body_size_1 = (size_t)src_local[2];
              capacity._4_4_ =
                   ptls_buffer__do_pushv
                             ((ptls_buffer_t *)src_local,outer_ext_end_local,(ulong)local_ce);
              if (capacity._4_4_ != 0) {
                return capacity._4_4_;
              }
              outer_ext_end_local = outer_ext_end_local + (int)(uint)local_ce;
              uStack_f0 = (long)src_local[2] - body_size_1;
              if (body_start_1 == 0xffffffffffffffff) {
                capacity._4_4_ =
                     ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)src_local,uStack_f0);
                if (capacity._4_4_ != 0) {
                  return capacity._4_4_;
                }
              }
              else {
                if ((body_start_1 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= uStack_f0)) {
                  return 0x20c;
                }
                for (; capacity._4_4_ = 0, body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                  (*src_local)[body_size_1 - body_start_1] =
                       (uint8_t)(uStack_f0 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                }
              }
            } while (*(uint8_t **)end_local != __v);
            if (*(uint8_t **)end_local != __v) {
              return 0x32;
            }
          }
          else {
            capacity_2._6_2_ = _capacity_1._6_2_;
            capacity_2._4_1_ = (undefined1)((ushort)_capacity_1._6_2_ >> 8);
            capacity_2._5_1_ = (undefined1)_capacity_1._6_2_;
            capacity._4_4_ =
                 ptls_buffer__do_pushv((ptls_buffer_t *)src_local,(void *)((long)&capacity_2 + 4),2)
            ;
            if (capacity._4_4_ != 0) {
              return capacity._4_4_;
            }
            body_start_2 = 2;
            capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)src_local,"",2);
            if (capacity._4_4_ != 0) {
              return capacity._4_4_;
            }
            puVar2 = src_local[2];
            iVar3 = ptls_buffer__do_pushv
                              ((ptls_buffer_t *)src_local,*(void **)end_local,
                               _capacity_2 - *(long *)end_local);
            if (iVar3 != 0) {
              return iVar3;
            }
            *(size_t *)end_local = _capacity_2;
            uVar4 = (long)src_local[2] - (long)puVar2;
            if (0xffff < uVar4) {
              return 0x20c;
            }
            for (; capacity._4_4_ = 0, body_start_2 != 0; body_start_2 = body_start_2 - 1) {
              (*src_local)[(long)puVar2 - body_start_2] =
                   (uint8_t)(uVar4 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
            }
          }
        } while (*(size_t *)end_local == _capacity_2);
        capacity._4_4_ = 0x32;
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

static int rebuild_ch_inner_extensions(ptls_buffer_t *buf, const uint8_t **src, const uint8_t *const end, const uint8_t *outer_ext,
                                       const uint8_t *outer_ext_end)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_decode_open_block(*src, end, 2, {
            while (*src != end) {
                uint16_t exttype;
                if ((ret = ptls_decode16(&exttype, src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(*src, end, 2, {
                    if (exttype == PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS) {
                        ptls_decode_open_block(*src, end, 1, {
                            do {
                                uint16_t reftype;
                                uint16_t outertype;
                                uint16_t outersize;
                                if ((ret = ptls_decode16(&reftype, src, end)) != 0)
                                    goto Exit;
                                if (reftype == PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO) {
                                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                    goto Exit;
                                }
                                while (1) {
                                    if (ptls_decode16(&outertype, &outer_ext, outer_ext_end) != 0 ||
                                        ptls_decode16(&outersize, &outer_ext, outer_ext_end) != 0) {
                                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                        goto Exit;
                                    }
                                    assert(outer_ext_end - outer_ext >= outersize);
                                    if (outertype == reftype)
                                        break;
                                    outer_ext += outersize;
                                }
                                buffer_push_extension(buf, reftype, {
                                    ptls_buffer_pushv(buf, outer_ext, outersize);
                                    outer_ext += outersize;
                                });
                            } while (*src != end);
                        });
                    } else {
                        buffer_push_extension(buf, exttype, {
                            ptls_buffer_pushv(buf, *src, end - *src);
                            *src = end;
                        });
                    }
                });
            }
        });
    });

Exit:
    return ret;
}